

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

Vec_Int_t * Gia_ManProfileHash(Gia_Man_t *p,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Hsh_VecMan_t *p_01;
  Vec_Int_t *vVec;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_44;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vArray;
  Vec_Int_t *vRes;
  Hsh_VecMan_t *pHash;
  Vec_Int_t *vCodeOffsets_local;
  Vec_Int_t *vCode_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Hsh_VecManStart(iVar1);
  vVec = Vec_IntAlloc(100);
  Hsh_VecManAdd(p_01,vVec);
  local_44 = 0;
  while( true ) {
    bVar4 = false;
    if (local_44 < p->nObjs) {
      pGVar3 = Gia_ManObj(p,local_44);
      bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    Gia_ManProfileCollect(p,local_44,vCode,vCodeOffsets,vVec);
    iVar1 = Hsh_VecManAdd(p_01,vVec);
    Vec_IntPush(p_00,iVar1);
    local_44 = local_44 + 1;
  }
  Hsh_VecManStop(p_01);
  Vec_IntFree(vVec);
  iVar1 = Vec_IntSize(p_00);
  iVar2 = Gia_ManObjNum(p);
  if (iVar1 == iVar2) {
    return p_00;
  }
  __assert_fail("Vec_IntSize(vRes) == Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,0x354,"Vec_Int_t *Gia_ManProfileHash(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManProfileHash( Gia_Man_t * p, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets )
{
    Hsh_VecMan_t * pHash;
    Vec_Int_t * vRes, * vArray;
    Gia_Obj_t * pObj;
    int i;
    vRes = Vec_IntAlloc( Gia_ManObjNum(p) );
    pHash = Hsh_VecManStart( Gia_ManObjNum(p) );
    // add empty entry
    vArray = Vec_IntAlloc( 100 );
    Hsh_VecManAdd( pHash, vArray );
    // iterate through the entries
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ManProfileCollect( p, i, vCode, vCodeOffsets, vArray );
        Vec_IntPush( vRes, Hsh_VecManAdd( pHash, vArray ) );
    }
    Hsh_VecManStop( pHash );
    Vec_IntFree( vArray );
    assert( Vec_IntSize(vRes) == Gia_ManObjNum(p) );
    return vRes;
}